

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_True_Test::Body(iu_SyntaxTest_x_iutest_x_True_Test *this)

{
  bool bVar1;
  Fixed *pFVar2;
  char *pcVar3;
  char *in_R9;
  string local_840;
  AssertionHelper local_820;
  Fixed local_7f0;
  undefined1 local_668 [8];
  AssertionResult iutest_ar_3;
  undefined1 local_638 [7];
  bool b_3;
  AssertionHelper local_618;
  Fixed local_5e8;
  undefined1 local_460 [8];
  AssertionResult iutest_ar_2;
  undefined1 local_430 [7];
  bool b_2;
  AssertionHelper local_410;
  Fixed local_3e0;
  undefined1 local_258 [8];
  AssertionResult iutest_ar_1;
  undefined1 local_228 [3];
  bool b_1;
  AssertionHelper local_208;
  Fixed local_1d8;
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  bool b;
  iu_SyntaxTest_x_iutest_x_True_Test *this_local;
  
  iutest_ar._39_1_ = 1;
  iutest::detail::AlwaysZero();
  iutest::AssertionResult::Is<bool>((AssertionResult *)local_40,(bool *)&iutest_ar.field_0x27);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_1d8,(bool)(iutest_ar._39_1_ & 1));
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_228,(internal *)local_40,(AssertionResult *)0x54d9e7,"false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0x29,pcVar3,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_208,pFVar2);
    iutest::AssertionHelper::~AssertionHelper(&local_208);
    std::__cxx11::string::~string((string *)local_228);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (iutest_ar_1._36_4_ == 0) {
    iutest_ar_1._35_1_ = 1;
    iutest::detail::AlwaysZero();
    iutest::AssertionResult::Is<bool>((AssertionResult *)local_258,(bool *)&iutest_ar_1.field_0x23);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
    if (!bVar1) {
      memset(&local_3e0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3e0);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_3e0,(bool)(iutest_ar_1._35_1_ & 1))
      ;
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)local_430,(internal *)local_258,(AssertionResult *)0x54d9e7,"false",
                 "true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iutest::AssertionHelper::AssertionHelper
                (&local_410,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x2b,pcVar3,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_410,pFVar2);
      iutest::AssertionHelper::~AssertionHelper(&local_410);
      std::__cxx11::string::~string((string *)local_430);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3e0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_258);
    iutest_ar_2._39_1_ = 1;
    iutest::detail::AlwaysZero();
    iutest::AssertionResult::Is<bool>((AssertionResult *)local_460,(bool *)&iutest_ar_2.field_0x27);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
    if (!bVar1) {
      memset(&local_5e8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5e8);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_5e8,(bool)(iutest_ar_2._39_1_ & 1))
      ;
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)local_638,(internal *)local_460,(AssertionResult *)0x54d9e7,"false",
                 "true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iutest::AssertionHelper::AssertionHelper
                (&local_618,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x2d,pcVar3,kWarning);
      iutest::AssertionHelper::operator=(&local_618,pFVar2);
      iutest::AssertionHelper::~AssertionHelper(&local_618);
      std::__cxx11::string::~string((string *)local_638);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5e8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_460);
    iutest_ar_3._39_1_ = 1;
    iutest::detail::AlwaysZero();
    iutest::AssertionResult::Is<bool>((AssertionResult *)local_668,(bool *)&iutest_ar_3.field_0x27);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_668);
    if (!bVar1) {
      memset(&local_7f0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_7f0);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_7f0,(bool)(iutest_ar_3._39_1_ & 1))
      ;
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_840,(internal *)local_668,(AssertionResult *)0x54d9e7,"false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iutest::AssertionHelper::AssertionHelper
                (&local_820,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x2f,pcVar3,kAssumeFailure);
      iutest::AssertionHelper::operator=(&local_820,pFVar2);
      iutest::AssertionHelper::~AssertionHelper(&local_820);
      std::__cxx11::string::~string((string *)&local_840);
      iutest::AssertionHelper::Fixed::~Fixed(&local_7f0);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_668);
  }
  return;
}

Assistant:

IUTEST(SyntaxTest, True)
{
    if( bool b = true )
        IUTEST_ASSERT_TRUE(b) << b;
    if( bool b = true )
        IUTEST_EXPECT_TRUE(b) << b;
    if( bool b = true )
        IUTEST_INFORM_TRUE(b) << b;
    if( bool b = true )
        IUTEST_ASSUME_TRUE(b) << b;
}